

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibIO.cpp
# Opt level: O3

void lib::io::ReadByFormat(StackAPI *api,FILE *file,string *format)

{
  int iVar1;
  value_type *__val;
  long __off;
  long lVar2;
  size_t len;
  char *pcVar3;
  char *len_00;
  size_type __n;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_49;
  vector<char,_std::allocator<char>_> local_48;
  
  iVar1 = std::__cxx11::string::compare((char *)format);
  if (iVar1 == 0) {
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    iVar1 = __isoc99_fscanf(file,"%lg");
    if (iVar1 == 1) {
      luna::StackAPI::PushNumber
                (api,(double)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    }
    else {
      luna::StackAPI::PushNil(api);
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)format);
    if (iVar1 == 0) {
      __off = ftell((FILE *)file);
      fseek((FILE *)file,0,2);
      lVar2 = ftell((FILE *)file);
      fseek((FILE *)file,__off,0);
      __n = lVar2 - __off;
      if (__n == 0) {
        luna::StackAPI::PushString(api,"");
        return;
      }
      std::vector<char,_std::allocator<char>_>::vector(&local_48,__n,&local_49);
      len = fread(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,1,__n,(FILE *)file);
      luna::StackAPI::PushString
                (api,local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,len);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)format);
      if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)format), iVar1 != 0)) {
        luna::StackAPI::PushNil(api);
        return;
      }
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x81);
      pcVar3 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x81;
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = pcVar3;
      memset(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x81);
      len_00 = (char *)0x0;
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar3;
      while (pcVar3 = fgets(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + (long)len_00,0x81,(FILE *)file),
            pcVar3 != (char *)0x0) {
        pcVar3 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                 (-1 - (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
        if (len_00 < pcVar3) {
          do {
            if ((local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)len_00] == '\0') ||
               (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[(long)len_00] == '\n')) goto LAB_0012067f;
            len_00 = len_00 + 1;
          } while (len_00 < pcVar3);
        }
        else {
LAB_0012067f:
          if (len_00 != pcVar3) {
            if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[(long)len_00] == '\n') {
              iVar1 = std::__cxx11::string::compare((char *)format);
              len_00 = len_00 + (iVar1 == 0);
            }
            luna::StackAPI::PushString
                      (api,local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,(size_t)len_00);
            goto LAB_00120784;
          }
        }
        std::vector<char,_std::allocator<char>_>::resize
                  (&local_48,
                   (size_type)
                   (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish +
                   (0x80 - (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start)));
        len_00 = pcVar3;
      }
      if (len_00 == (char *)0x0) {
        luna::StackAPI::PushNil(api);
      }
      else {
        luna::StackAPI::PushString
                  (api,local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,(size_t)len_00);
      }
    }
LAB_00120784:
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void ReadByFormat(luna::StackAPI &api, std::FILE *file,
                      const std::string format)
    {
        if (format == "*n")
        {
            // Read a number
            double num = 0.0;
            if (std::fscanf(file, "%lg", &num) == 1)
                api.PushNumber(num);
            else
                api.PushNil();
        }
        else if (format == "*a")
        {
            // Read total content of file
            auto cur = std::ftell(file);
            std::fseek(file, 0, SEEK_END);
            auto bytes = std::ftell(file) - cur;
            std::fseek(file, cur, SEEK_SET);
            if (bytes == 0)
                api.PushString("");
            else
            {
                std::vector<char> buf(bytes);
                bytes = std::fread(&buf[0], sizeof(buf[0]), bytes, file);
                api.PushString(&buf[0], bytes);
            }
        }
        else if (format == "*l" || format == "*L")
        {
            // Read line
            const std::size_t part = 128;
            const std::size_t part_count = part + 1;

            std::size_t count = 0;
            std::vector<char> buf(part_count);
            do
            {
                if (!std::fgets(&buf[count], part_count, file))
                {
                    // EOF or an error occured
                    // if count is 0, push a nil as end of file
                    // otherwise, push the buf as string
                    if (count == 0)
                        api.PushNil();
                    else
                        api.PushString(&buf[0], count);
                    break;
                }
                else
                {
                    auto size = buf.size();
                    while (count < size - 1 &&
                            buf[count] != '\n' && buf[count] != '\0')
                        ++count;
                    // buf[size - 1] must be '\0'
                    if (count == size - 1)
                    {
                        // '\n' is not exist, extend buf to continue read
                        buf.resize(size + part);
                    }
                    else
                    {
                        // If buf[count] is '\n', keep '\n' when
                        // format is "*L"
                        if (buf[count] == '\n' && format == "*L") ++count;
                        api.PushString(&buf[0], count);
                        break;
                    }
                }
            } while (true);
        }
        else
            api.PushNil();
    }